

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

bool __thiscall
duckdb_httplib::ClientImpl::handle_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  Socket *socket;
  bool bVar1;
  int iVar2;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  Request req2;
  Request req_save;
  
  if ((req->path)._M_string_length == 0) {
    *error = Connection;
    return false;
  }
  Request::Request(&req_save,req);
  iVar2 = (*this->_vptr_ClientImpl[6])(this);
  if ((((char)iVar2 == '\0') && ((this->proxy_host_)._M_string_length != 0)) &&
     (this->proxy_port_ != -1)) {
    Request::Request(&req2,req);
    std::operator+(&local_560,"http://",&this->host_and_port_);
    std::operator+(&local_580,&local_560,&req->path);
    std::__cxx11::string::operator=((string *)&req2.path,(string *)&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_560);
    bVar1 = process_request(this,strm,&req2,res,close_connection,error);
    Request::operator=(req,&req2);
    std::__cxx11::string::_M_assign((string *)&req->path);
    Request::~Request(&req2);
    if (bVar1) {
LAB_0143ab33:
      std::__cxx11::string::string((string *)&local_580,"Connection",(allocator *)&local_560);
      Response::get_header_value(&req2.method,res,&local_580,0);
      bVar1 = std::operator==(&req2.method,"close");
      if (bVar1) {
        std::__cxx11::string::~string((string *)&req2);
        std::__cxx11::string::~string((string *)&local_580);
LAB_0143ab8a:
        std::mutex::lock(&this->socket_mutex_);
        socket = &this->socket_;
        (*this->_vptr_ClientImpl[4])(this,socket,1);
        shutdown_socket(this,socket);
        close_socket(this,socket);
        pthread_mutex_unlock((pthread_mutex_t *)&this->socket_mutex_);
      }
      else {
        bVar1 = std::operator==(&res->version,"HTTP/1.0");
        if (bVar1) {
          bVar1 = std::operator!=(&res->reason,"Connection established");
          std::__cxx11::string::~string((string *)&req2);
          std::__cxx11::string::~string((string *)&local_580);
          if (bVar1) goto LAB_0143ab8a;
        }
        else {
          std::__cxx11::string::~string((string *)&req2);
          std::__cxx11::string::~string((string *)&local_580);
        }
      }
      bVar1 = true;
      if ((res->status - 0x12dU < 99) && (this->follow_location_ == true)) {
        Request::operator=(req,&req_save);
        bVar1 = redirect(this,req,res,error);
      }
      goto LAB_0143ad4e;
    }
  }
  else {
    bVar1 = process_request(this,strm,req,res,close_connection,error);
    if (bVar1) goto LAB_0143ab33;
  }
  bVar1 = false;
LAB_0143ad4e:
  Request::~Request(&req_save);
  return bVar1;
}

Assistant:

inline bool ClientImpl::handle_request(Stream &strm, Request &req,
                                       Response &res, bool close_connection,
                                       Error &error) {
  if (req.path.empty()) {
    error = Error::Connection;
    return false;
  }

  auto req_save = req;

  bool ret;

  if (!is_ssl() && !proxy_host_.empty() && proxy_port_ != -1) {
    auto req2 = req;
    req2.path = "http://" + host_and_port_ + req.path;
    ret = process_request(strm, req2, res, close_connection, error);
    req = req2;
    req.path = req_save.path;
  } else {
    ret = process_request(strm, req, res, close_connection, error);
  }

  if (!ret) { return false; }

  if (res.get_header_value("Connection") == "close" ||
      (res.version == "HTTP/1.0" && res.reason != "Connection established")) {
    // TODO this requires a not-entirely-obvious chain of calls to be correct
    // for this to be safe.

    // This is safe to call because handle_request is only called by send_
    // which locks the request mutex during the process. It would be a bug
    // to call it from a different thread since it's a thread-safety issue
    // to do these things to the socket if another thread is using the socket.
    std::lock_guard<std::mutex> guard(socket_mutex_);
    shutdown_ssl(socket_, true);
    shutdown_socket(socket_);
    close_socket(socket_);
  }

  if (300 < res.status && res.status < 400 && follow_location_) {
    req = req_save;
    ret = redirect(req, res, error);
  }

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  if ((res.status == StatusCode::Unauthorized_401 ||
       res.status == StatusCode::ProxyAuthenticationRequired_407) &&
      req.authorization_count_ < 5) {
    auto is_proxy = res.status == StatusCode::ProxyAuthenticationRequired_407;
    const auto &username =
        is_proxy ? proxy_digest_auth_username_ : digest_auth_username_;
    const auto &password =
        is_proxy ? proxy_digest_auth_password_ : digest_auth_password_;

    if (!username.empty() && !password.empty()) {
      std::map<std::string, std::string> auth;
      if (detail::parse_www_authenticate(res, auth, is_proxy)) {
        Request new_req = req;
        new_req.authorization_count_ += 1;
        new_req.headers.erase(is_proxy ? "Proxy-Authorization"
                                       : "Authorization");
        new_req.headers.insert(detail::make_digest_authentication_header(
            req, auth, new_req.authorization_count_, detail::random_string(10),
            username, password, is_proxy));

        Response new_res;

        ret = send(new_req, new_res, error);
        if (ret) { res = new_res; }
      }
    }
  }
#endif

  return ret;
}